

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall World::World(World *this,string *input_file)

{
  pointer *pppPVar1;
  iterator __position;
  pointer ppPVar2;
  Primitive *primitive;
  vector<int4,_std::allocator<int4>_> *meshes;
  vector<Vector3,_std::allocator<Vector3>_> *points;
  int iVar3;
  int iVar4;
  istream *piVar5;
  Bezier *pBVar6;
  Light *this_00;
  ostream *poVar7;
  pointer ppPVar8;
  Primitive *new_primitive;
  vector<Primitive_*,_std::allocator<Primitive_*>_> *__range1;
  string var;
  string order;
  string obj;
  string type;
  ifstream fin;
  Bezier *local_488;
  World *local_480;
  vector<int4,_std::allocator<int4>_> *local_478;
  vector<Vector3,_std::allocator<Vector3>_> *local_470;
  vector<Primitive*,std::allocator<Primitive*>> *local_468;
  Camera *local_460;
  string local_458;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  _func_int **local_418;
  _func_int **local_410;
  Vector3 *local_408;
  string local_400;
  char *local_3e0;
  long local_3d8;
  char local_3d0 [16];
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  istream local_238 [520];
  
  local_460 = &this->camera;
  Camera::Camera(local_460);
  (this->bgc).z = 0.0;
  (this->bgc).x = 0.0;
  (this->bgc).y = 0.0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->meshes).super__Vector_base<int4,_std::allocator<int4>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->SHADE_QUALITY = 4;
  iVar3 = std::__cxx11::string::compare((char *)input_file);
  if (iVar3 != 0) {
    local_470 = &this->points;
    local_478 = &this->meshes;
    local_468 = (vector<Primitive*,std::allocator<Primitive*>> *)&this->pris;
    std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
    local_408 = &this->bgc;
    local_3e0 = local_3d0;
    local_3d8 = 0;
    local_3d0[0] = '\0';
    local_410 = (_func_int **)&PTR_getColor_0011d850;
    local_418 = (_func_int **)&PTR_getColor_0011d8b0;
    local_480 = this;
LAB_0010cff8:
    piVar5 = std::operator>>(local_238,(string *)&local_3e0);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      local_488 = (Bezier *)0x0;
      iVar3 = std::__cxx11::string::compare((char *)&local_3e0);
      if (iVar3 == 0) {
        local_3c0 = local_3b0;
        local_3b8 = 0;
        local_3b0[0] = 0;
        std::operator>>(local_238,(string *)&local_3c0);
        iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
        if (iVar3 == 0) {
          pBVar6 = (Bezier *)operator_new(0xd0);
          Primitive::Primitive((Primitive *)pBVar6);
          (pBVar6->super_Primitive)._vptr_Primitive = local_410;
          (pBVar6->bbox).boundary[0] = 0.0;
          (pBVar6->bbox).boundary[1] = 0.0;
          (pBVar6->bbox).boundary[2] = 0.0;
          BoundingBox::BoundingBox((BoundingBox *)((pBVar6->bbox).boundary + 4));
          local_488 = pBVar6;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
        if (iVar3 == 0) {
          pBVar6 = (Bezier *)operator_new(0xf0);
          Primitive::Primitive((Primitive *)pBVar6);
          (pBVar6->super_Primitive)._vptr_Primitive = local_418;
          (pBVar6->bbox).boundary[0] = 0.0;
          (pBVar6->bbox).boundary[1] = 0.0;
          (pBVar6->bbox).boundary[2] = 0.0;
          (pBVar6->bbox).boundary[4] = 0.0;
          (pBVar6->bbox).boundary[5] = 0.0;
          (pBVar6->px).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar6->px).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pBVar6->px).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pBVar6->py).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar6->py).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pBVar6->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar6->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_488 = pBVar6;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
        if (iVar3 == 0) {
          pBVar6 = (Bezier *)operator_new(400);
          Bezier::Bezier(pBVar6);
          local_488 = pBVar6;
LAB_0010d239:
          __position._M_current =
               (local_480->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_480->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Primitive*,std::allocator<Primitive*>>::_M_realloc_insert<Primitive*const&>
                      (local_468,__position,(Primitive **)&local_488);
          }
          else {
            *__position._M_current = &local_488->super_Primitive;
            pppPVar1 = &(local_480->pris).
                        super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppPVar1 = *pppPVar1 + 1;
          }
        }
        else if (local_488 != (Bezier *)0x0) goto LAB_0010d239;
        if (local_3c0 != local_3b0) {
          operator_delete(local_3c0);
        }
        goto LAB_0010d282;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_3e0);
      if (iVar3 == 0) {
        local_3c0 = local_3b0;
        local_3b8 = 0;
        local_3b0[0] = 0;
        std::operator>>(local_238,(string *)&local_3c0);
        this_00 = (Light *)operator_new(0x68);
        Light::Light(this_00);
        local_480->light = this_00;
        if (local_3c0 != local_3b0) {
          operator_delete(local_3c0);
        }
        goto LAB_0010d284;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_3e0);
      if (iVar3 != 0) goto code_r0x0010d063;
    }
    ppPVar8 = (local_480->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppPVar2 = (local_480->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppPVar8 != ppPVar2) {
      do {
        primitive = *ppPVar8;
        (*primitive->_vptr_Primitive[1])(primitive);
        (*primitive->_vptr_Primitive[4])(primitive,local_470,local_478);
        poVar7 = operator<<((ostream *)&std::cout,primitive);
        local_3c0 = (undefined1 *)CONCAT71(local_3c0._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3c0,1);
        ppPVar8 = ppPVar8 + 1;
      } while (ppPVar8 != ppPVar2);
    }
    points = local_470;
    meshes = local_478;
    Camera::generateMeshes(local_460,local_470,local_478);
    Light::generateMeshes(local_480->light,points,meshes);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
    std::ifstream::~ifstream(local_238);
  }
  return;
code_r0x0010d063:
  iVar3 = std::__cxx11::string::compare((char *)&local_3e0);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_3e0), iVar3 == 0)) {
LAB_0010d282:
    this_00 = (Light *)0x0;
LAB_0010d284:
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_3e0,local_3d8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::istream::ignore((long)local_238,0x400);
    local_438 = local_428;
    local_430 = 0;
    local_428[0] = 0;
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_238,(string *)&local_438,'\n');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_3c0,(string *)&local_438,_S_out|_S_in);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      local_458._M_string_length = 0;
      local_458.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&local_3c0,(string *)&local_458);
      iVar3 = std::__cxx11::string::compare((char *)&local_458);
      if (iVar3 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_3e0);
        if (iVar4 == 0) {
          operator>>((stringstream *)&local_3c0,local_408);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_3e0);
        if (local_488 != (Bezier *)0x0 && iVar4 == 0) {
          (*(local_488->super_Primitive)._vptr_Primitive[3])
                    (local_488,&local_458,(stringstream *)&local_3c0);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_3e0);
        if ((this_00 != (Light *)0x0) && (iVar4 == 0)) {
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_400,local_458._M_dataplus._M_p,
                     local_458._M_dataplus._M_p + local_458._M_string_length);
          Light::input(this_00,&local_400,(stringstream *)&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_3e0);
        if (iVar4 == 0) {
          Camera::input(local_460,&local_458,(stringstream *)&local_3c0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
      std::ios_base::~ios_base(local_340);
    } while (iVar3 != 0);
    if (local_438 != local_428) {
      operator_delete(local_438);
    }
  }
  goto LAB_0010cff8;
}

Assistant:

World::World(std::string input_file) {
    SHADE_QUALITY = 4;
    if ( input_file == "" ) return;
    std::ifstream fin( input_file.c_str() );

    std::string obj;
    while ( fin >> obj ) {
        Primitive* new_primitive = NULL;
        Light* new_light = NULL;

        if ( obj == "primitive" ) {
            std::string type;
            fin >> type;
            if (type == "sphere") new_primitive = new Sphere;
            if (type == "plane" ) new_primitive = new Plane;
            if (type == "bezier") new_primitive = new Bezier;
            if (new_primitive != NULL) pris.push_back(new_primitive);
        }
//            if ( type == "rectangle" ) new_primitive = new Rectangle;
//            if ( type == "triangle" ) new_primitive = new Triangle;
//            if ( type == "polyhedron" ) new_primitive = new Polyhedron;
//            AddPrimitive( new_primitive );
//        }
        else
        if ( obj == "light" ) {
            std::string type; fin >> type;
            new_light = new Light;
//            if ( type == "point" ) new_light = new PointLight;
//            if ( type == "area" ) new_light = new AreaLight;
//            AddLight( new_light );
            light = new_light;
        } else
        if (obj == "end") break;
        else if ( obj != "background" && obj != "camera" ) continue;
        std::cout << obj << std::endl;

        fin.ignore( 1024 , '\n' );

        std::string order;
        while ( std::getline( fin , order , '\n' ) ) {
            std::stringstream fin2( order );
            std::string var; fin2 >> var;
            if ( var == "end" ) {
                //if (obj == "primitive" && new_primitive != NULL) new_primitive->PreTreatment();
                break;
            }

            if ( obj == "background") fin2 >> bgc;
            if ( obj == "primitive" && new_primitive != NULL ) new_primitive->input( var , fin2 );
            if ( obj == "light" && new_light != NULL ) new_light->input( var , fin2 );
            if ( obj == "camera" ) camera.input( var , fin2 );
        }
    }
    for (auto i : pris) {
        i->init();
        i->generateMeshes(points, meshes);
        std::cout << *i << '\n';
    }
    camera.generateMeshes(points, meshes);
    light->generateMeshes(points, meshes);
}